

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  ulong uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Index innerSize;
  undefined8 *puVar5;
  Index outerSize;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  long lVar11;
  
  uVar1 = *(ulong *)other;
  uVar7 = *(ulong *)(other + 8);
  if ((uVar7 != 0 && uVar1 != 0) &&
     (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar3 / SEXT816((long)uVar7),0) < (long)uVar1)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8,other,SUB168(auVar3 % SEXT816((long)uVar7),0))
    ;
    *puVar5 = operator_delete;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((long)(uVar7 | uVar1) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ctsuu[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)this,uVar7 * uVar1,uVar1,uVar7);
  auVar4 = _DAT_00112dd0;
  auVar3 = _DAT_00112dc0;
  lVar2 = *(long *)(this + 8);
  if ((lVar2 == *(long *)other) && (uVar1 = *(ulong *)(this + 0x10), uVar1 == *(ulong *)(other + 8))
     ) {
    if (0 < (long)uVar1) {
      lVar6 = lVar2 + -1;
      auVar9._8_4_ = (int)lVar6;
      auVar9._0_8_ = lVar6;
      auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
      lVar6 = *(long *)this + 8;
      uVar7 = 0;
      auVar9 = auVar9 ^ _DAT_00112dd0;
      do {
        if (0 < lVar2) {
          uVar8 = 0;
          auVar10 = auVar3;
          do {
            auVar12 = auVar10 ^ auVar4;
            if ((bool)(~(auVar9._4_4_ < auVar12._4_4_ ||
                        auVar9._0_4_ < auVar12._0_4_ && auVar12._4_4_ == auVar9._4_4_) & 1)) {
              uVar13 = 0x3ff0000000000000;
              if (uVar7 != uVar8) {
                uVar13 = 0;
              }
              *(undefined8 *)(lVar6 + -8 + uVar8 * 8) = uVar13;
            }
            if (auVar12._12_4_ <= auVar9._12_4_ &&
                (auVar12._8_4_ <= auVar9._8_4_ || auVar12._12_4_ != auVar9._12_4_)) {
              uVar13 = 0x3ff0000000000000;
              if (uVar7 - 1 != uVar8) {
                uVar13 = 0;
              }
              *(undefined8 *)(lVar6 + uVar8 * 8) = uVar13;
            }
            uVar8 = uVar8 + 2;
            lVar11 = auVar10._8_8_;
            auVar10._0_8_ = auVar10._0_8_ + 2;
            auVar10._8_8_ = lVar11 + 2;
          } while ((lVar2 + 1U & 0xfffffffffffffffe) != uVar8);
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + lVar2 * 8;
      } while (uVar7 != uVar1);
    }
    return (Matrix<double,__1,__1,_0,__1,__1> *)this;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ctsuu[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/Core/Assign.h"
                ,0x1f9,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }